

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu541.c
# Opt level: O2

MPP_RET vepu541_h265_set_roi(void *dst_buf,void *src_buf,RK_S32 w,RK_S32 h)

{
  RK_S32 cu16_num_line;
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  
  uVar3 = w + 0x3f >> 6;
  uVar1 = h + 0x3f >> 6;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar5;
  }
  for (; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    pvVar7 = dst_buf;
    for (uVar4 = 0; uVar4 != uVar6; uVar4 = uVar4 + 1) {
      for (uVar8 = 0; uVar8 != 0x10; uVar8 = uVar8 + 1) {
        *(undefined2 *)((long)pvVar7 + uVar8 * 2) =
             *(undefined2 *)
              ((long)src_buf +
              (long)(int)(((uint)(uVar8 >> 2) & 0x3fffffff | (int)uVar5 * 4) * uVar3 * 4 +
                         ((uint)uVar8 & 3 | (int)uVar4 * 4)) * 2);
      }
      pvVar7 = (void *)((long)pvVar7 + 0x20);
    }
    dst_buf = (void *)((long)dst_buf + (long)(int)uVar3 * 0x20);
  }
  return MPP_OK;
}

Assistant:

MPP_RET vepu541_h265_set_roi(void *dst_buf, void *src_buf, RK_S32 w, RK_S32 h)
{
    Vepu541RoiCfg *src = (Vepu541RoiCfg *)src_buf;
    Vepu541RoiCfg *dst = (Vepu541RoiCfg *)dst_buf;
    RK_S32 mb_w = MPP_ALIGN(w, 64) / 64;
    RK_S32 mb_h = MPP_ALIGN(h, 64) / 64;
    RK_S32 ctu_line = mb_w;
    RK_S32 i, j, cu16cnt;

    for (j = 0; j < mb_h; j++) {
        for ( i = 0; i < mb_w; i++) {
            RK_S32 ctu_addr = j * ctu_line + i;
            RK_S32 cu16_num_line = ctu_line * 4;
            for ( cu16cnt = 0; cu16cnt < 16; cu16cnt++) {
                RK_S32 cu16_x;
                RK_S32 cu16_y;
                RK_S32 cu16_addr_in_frame;
                cu16_x = cu16cnt & 3;
                cu16_y = cu16cnt / 4;
                cu16_x += i * 4;
                cu16_y += j * 4;
                cu16_addr_in_frame = cu16_x + cu16_y * cu16_num_line;
                dst[ctu_addr * 16 + cu16cnt] = src[cu16_addr_in_frame];
            }
        }
    }
    return MPP_OK;
}